

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O2

vector<TCacheReq,_std::allocator<TCacheReq>_> *
RandomAssignment(vector<TCacheReq,_std::allocator<TCacheReq>_> *__return_storage_ptr__,TProblem *p)

{
  unsigned_long uVar1;
  iterator iVar2;
  ulong uVar3;
  size_t sVar4;
  result_type videoId;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  selected;
  uniform_int_distribution<unsigned_long> randomVideo;
  mt19937 rng;
  result_type local_1418;
  TCacheReq local_1410;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1400;
  uniform_int_distribution<unsigned_long> local_13c8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_13b8);
  local_13c8._M_param._M_a = 0;
  local_13c8._M_param._M_b =
       ((long)(p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) - 1;
  (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar3 = 0; uVar3 < p->CacheCount; uVar3 = uVar3 + 1) {
    local_1400._M_buckets = &local_1400._M_single_bucket;
    local_1400._M_bucket_count = 1;
    local_1400._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1400._M_element_count = 0;
    local_1400._M_rehash_policy._M_max_load_factor = 1.0;
    local_1400._M_rehash_policy._M_next_resize = 0;
    local_1400._M_single_bucket = (__node_base_ptr)0x0;
    sVar4 = p->CacheSize;
    while ((local_1400._M_element_count !=
            (long)(p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3 &&
           (local_1418 = std::uniform_int_distribution<unsigned_long>::operator()
                                   (&local_13c8,&local_13b8),
           (p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[local_1418] <= sVar4))) {
      iVar2 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&local_1400,&local_1418);
      if (iVar2.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
        std::__detail::
        _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&local_1400,&local_1418);
        uVar1 = (p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start[local_1418];
        local_1410.VideoId = local_1418;
        local_1410.ServerId = uVar3;
        std::vector<TCacheReq,_std::allocator<TCacheReq>_>::emplace_back<TCacheReq>
                  (__return_storage_ptr__,&local_1410);
        sVar4 = sVar4 - uVar1;
      }
    }
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_1400);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TCacheReq> RandomAssignment(const TProblem& p) {
    std::mt19937 rng;
    std::uniform_int_distribution<size_t> randomVideo(0, p.Vides.size() - 1);

    std::vector<TCacheReq> reqs;

    for (size_t i = 0; i < p.CacheCount; ++i) {
        std::unordered_set<size_t> selected;

        size_t capacity = p.CacheSize;
        while (true) {
            if (selected.size() == p.Vides.size()) {
                break;
            }

            auto videoId = randomVideo(rng);
            if (p.Vides[videoId] > capacity) {
                break;
            }

            if (selected.find(videoId) != selected.end()) {
                continue;
            }

            selected.insert(videoId);
            capacity -= p.Vides[videoId];

            reqs.emplace_back(TCacheReq{i, videoId});
        }
    }

    return reqs;
}